

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# welcome_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::WelcomeMessageTest_test_encodes_a_message_into_a_buffer_Test::
TestBody(WelcomeMessageTest_test_encodes_a_message_into_a_buffer_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_90;
  Message local_88 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  ByteBuffer buffer;
  WelcomeMessageTest_test_encodes_a_message_into_a_buffer_Test *this_local;
  
  bidfx_public_api::price::pixie::WelcomeMessage::Encode((int)&gtest_ar + 8);
  bidfx_public_api::tools::BufferUtil::BufferAsHex_abi_cxx11_((ByteBuffer *)&local_70);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_50,"ENCODED_MESSAGE","BufferUtil::BufferAsHex(buffer)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ENCODED_MESSAGE_abi_cxx11_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/welcome_message_test.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(WelcomeMessageTest, test_encodes_a_message_into_a_buffer)
{
    ByteBuffer buffer = WELCOME_MESSAGE.Encode(PixieVersion::CURRENT_VERSION);
    ASSERT_EQ(ENCODED_MESSAGE, BufferUtil::BufferAsHex(buffer));
}